

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase675::run(TestCase675 *this)

{
  word *pwVar1;
  size_t sVar2;
  word wVar3;
  SegmentBuilder *pSVar4;
  WirePointer *pWVar5;
  SegmentBuilder *pSVar6;
  SegmentBuilder *pSVar7;
  WirePointer *pWVar8;
  int iVar9;
  word *pwVar10;
  word *pwVar11;
  bool bVar12;
  Reader value;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar13;
  Builder root;
  MallocMessageBuilder builder;
  PointerBuilder local_1c0;
  OrphanBuilder local_1a8;
  StructBuilder local_188;
  OrphanBuilder local_160;
  StructBuilder local_140 [2];
  StructBuilder in_stack_ffffffffffffff10;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)(local_140 + 1),0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1c0,(MessageBuilder *)(local_140 + 1));
  local_1a8.capTable = (CapTableBuilder *)local_1c0.pointer;
  local_1a8.tag.content = (uint64_t)local_1c0.segment;
  local_1a8.segment = (SegmentBuilder *)local_1c0.capTable;
  PointerBuilder::initStruct(&local_188,(PointerBuilder *)&local_1a8,(StructSize)0x140006);
  AVar13 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)(local_140 + 1));
  pwVar10 = (AVar13.ptr)->ptr;
  sVar2 = (AVar13.ptr)->size_;
  local_1a8.capTable = (CapTableBuilder *)(local_188.pointers + 2);
  local_1a8.tag.content = (uint64_t)local_188.segment;
  local_1a8.segment = (SegmentBuilder *)local_188.capTable;
  PointerBuilder::initStruct(local_140,(PointerBuilder *)&local_1a8,(StructSize)0x140006);
  initTestMessage((Builder)in_stack_ffffffffffffff10);
  AVar13 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)(local_140 + 1));
  pwVar11 = (AVar13.ptr)->ptr + (AVar13.ptr)->size_;
  local_1a8.tag.content = (uint64_t)local_188.segment;
  local_1a8.segment = (SegmentBuilder *)local_188.capTable;
  local_1a8.capTable = (CapTableBuilder *)local_188.pointers;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1a8,value);
  AVar13 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)(local_140 + 1));
  if ((AVar13.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0.segment = (SegmentBuilder *)CONCAT44(local_1c0.segment._4_4_,1);
    AVar13 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)(local_140 + 1));
    local_1a8.tag.content = AVar13.size_;
    kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2ad,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               (uint *)&local_1c0,(unsigned_long *)&local_1a8);
  }
  local_1c0.pointer = local_188.pointers + 2;
  local_1c0.segment = local_188.segment;
  local_1c0.capTable = local_188.capTable;
  PointerBuilder::disown(&local_1a8,&local_1c0);
  local_160.segment = local_1a8.segment;
  local_160.capTable = local_1a8.capTable;
  local_160.location = local_1a8.location;
  local_160.tag.content = local_1a8.tag.content;
  if (local_1a8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_160);
  }
  pwVar1 = pwVar10 + sVar2;
  bVar12 = pwVar11 <= pwVar1;
  if ((!bVar12) && ((char)pwVar1->content == '\0')) {
    pwVar10 = pwVar10 + sVar2;
    do {
      pwVar10 = (word *)((long)&pwVar10->content + 1);
      if (pwVar10 == pwVar11) break;
    } while ((char)pwVar10->content == '\0');
    bVar12 = pwVar11 <= pwVar10;
  }
  if ((!bVar12) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2b1,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
               (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
  }
  local_1a8.tag.content = (uint64_t)local_188.segment;
  local_1a8.segment = (SegmentBuilder *)local_188.capTable;
  local_1a8.capTable = (CapTableBuilder *)local_188.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_1c0,(PointerBuilder *)&local_1a8,(void *)0x0,0);
  wVar3.content = local_1a8.tag.content;
  pSVar4 = local_1a8.segment;
  pWVar5 = (WirePointer *)local_1a8.capTable;
  pSVar6 = local_188.segment;
  pSVar7 = (SegmentBuilder *)local_188.capTable;
  pWVar8 = local_188.pointers;
  if (((local_1c0.pointer != (WirePointer *)0x4) ||
      (iVar9 = bcmp(local_1c0.capTable,"foo",3), wVar3.content = local_1a8.tag.content,
      pSVar4 = local_1a8.segment, pWVar5 = (WirePointer *)local_1a8.capTable,
      pSVar6 = local_188.segment, pSVar7 = (SegmentBuilder *)local_188.capTable,
      pWVar8 = local_188.pointers, iVar9 != 0)) &&
     (local_1a8.capTable = (CapTableBuilder *)pWVar8, local_1a8.segment = pSVar7,
     local_1a8.tag.content = (uint64_t)pSVar6, kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_1c0,(PointerBuilder *)&local_1a8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2b3,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (char (*) [4])"foo",(Builder *)&local_1c0);
    wVar3.content = local_1a8.tag.content;
    pSVar4 = local_1a8.segment;
    pWVar5 = (WirePointer *)local_1a8.capTable;
  }
  local_1a8.capTable = (CapTableBuilder *)pWVar5;
  local_1a8.segment = pSVar4;
  local_1a8.tag.content = wVar3.content;
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)(local_140 + 1));
  return;
}

Assistant:

TEST(Orphans, StructsZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  initTestMessage(root.initStructField());
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownStructField();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}